

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo5.cpp
# Opt level: O2

int64_t primesum::pi_lmo5(int64_t x)

{
  int iVar1;
  double alpha;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  undefined1 x_04 [16];
  int256_t res;
  int iVar2;
  long lVar3;
  size_t size;
  long lVar4;
  int128_t *piVar5;
  uint64_t uVar6;
  ulong uVar7;
  int64_t iVar8;
  char *x_05;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint64_t uVar13;
  uint64_t low;
  bool bVar14;
  undefined8 in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  ulong uVar15;
  int256_t phi;
  allocator<char> local_1c1;
  uint64_t local_1c0;
  int128_t *local_1b8;
  uint64_t local_1b0;
  long local_1a8;
  uint64_t local_1a0;
  long local_198;
  ulong local_190;
  string local_188;
  vector<long,_std::allocator<long>_> phi_1;
  vector<int,_std::allocator<int>_> primes;
  int256_t local_138;
  double local_110;
  size_t local_108;
  uint64_t local_100;
  long local_f8;
  long local_f0;
  pointer local_e8;
  long local_e0;
  vector<int,_std::allocator<int>_> pi;
  Wheel wheel;
  vector<int,_std::allocator<int>_> lpf;
  vector<int,_std::allocator<int>_> mu;
  int256_t s1;
  int256_t p2;
  
  if (x < 2) {
    iVar8 = 0;
  }
  else {
    x_00._8_8_ = in_stack_fffffffffffffdf0;
    x_00._0_8_ = in_stack_fffffffffffffde8;
    alpha = get_alpha_lmo((primesum *)x,(int128_t)x_00);
    lVar3 = iroot<3,long>(x);
    local_1b8 = (int128_t *)(long)((double)lVar3 * alpha);
    local_1a8 = x / (long)local_1b8;
    if ((long)local_1b8 < 0xd) {
      local_1c0 = (uint64_t)*(int *)(PhiTiny::pi + (long)local_1b8 * 4);
    }
    else {
      local_1c0 = 6;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&phi,"",(allocator<char> *)&local_188);
    print((string *)&phi);
    std::__cxx11::string::~string((string *)&phi);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&phi,"=== pi_lmo5(x) ===",(allocator<char> *)&local_188);
    print((string *)&phi);
    std::__cxx11::string::~string((string *)&phi);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&phi,"pi(x) = S1 + S2 + pi(y) - 1 - P2",(allocator<char> *)&local_188);
    print((string *)&phi);
    std::__cxx11::string::~string((string *)&phi);
    piVar5 = local_1b8;
    x_01._8_8_ = in_stack_fffffffffffffdf0;
    x_01._0_8_ = in_stack_fffffffffffffde8;
    print((primesum *)x,(int128_t)x_01,0,(int64_t)local_1b8,local_1a8,alpha,(int)local_1c0);
    x_02._8_8_ = in_stack_fffffffffffffdf0;
    x_02._0_8_ = in_stack_fffffffffffffde8;
    P2(&p2,(primesum *)x,(int128_t)x_02,0,(int)piVar5);
    generate_moebius(&mu,(int64_t)piVar5);
    generate_lpf(&lpf,(int64_t)piVar5);
    generate_primes(&primes,(int64_t)piVar5);
    x_03._8_8_ = in_stack_fffffffffffffdf0;
    x_03._0_8_ = in_stack_fffffffffffffde8;
    S1(&s1,(primesum *)x,(int128_t)x_03,0,(int64_t)piVar5,(int)local_1c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&phi,"",(allocator<char> *)&local_188);
    print((string *)&phi);
    std::__cxx11::string::~string((string *)&phi);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&phi,"=== S2(x, y) ===",(allocator<char> *)&local_188);
    print((string *)&phi);
    std::__cxx11::string::~string((string *)&phi);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&phi,"Computation of the special leaves",(allocator<char> *)&local_188);
    print((string *)&phi);
    std::__cxx11::string::~string((string *)&phi);
    local_110 = get_time();
    local_100 = local_1a8 + 1;
    lVar3 = isqrt<long>(local_100);
    size = next_power_of_2<long>(lVar3);
    BitSieve::BitSieve((BitSieve *)&phi,size);
    Wheel::Wheel<std::vector<int,std::allocator<int>>>
              (&wheel,&primes,
               (long)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,1);
    generate_pi(&pi,(int64_t)piVar5);
    local_188._M_dataplus._M_p = (pointer)0x0;
    std::vector<long,_std::allocator<long>_>::vector
              (&phi_1,(long)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2,(value_type_conflict7 *)&local_188
               ,(allocator_type *)&local_138);
    local_108 = size;
    lVar3 = isqrt<long>((long)piVar5);
    local_f0 = (long)pi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar3];
    local_f8 = (long)pi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)piVar5];
    local_190 = 0;
    uVar13 = 1;
LAB_0011adc5:
    low = uVar13;
    uVar6 = local_1c0;
    if ((long)low <= local_1a8) {
      local_1a0 = low + local_108;
      uVar13 = local_1a0;
      if ((long)local_100 < (long)local_1a0) {
        uVar13 = local_100;
      }
      BitSieve::pre_sieve((BitSieve *)&phi,local_1c0,low);
      local_198 = uVar13 - low;
      local_1b0 = uVar13;
      while (uVar6 = uVar6 + 1, (long)uVar6 < local_f0) {
        iVar2 = primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[uVar6];
        lVar11 = (long)iVar2;
        lVar4 = x / (long)(local_1b0 * lVar11);
        lVar3 = (long)local_1b8 / lVar11;
        if ((long)local_1b8 / lVar11 < lVar4) {
          lVar3 = lVar4;
        }
        piVar5 = (int128_t *)(x / (long)(low * lVar11));
        if ((long)local_1b8 <= (long)piVar5) {
          piVar5 = local_1b8;
        }
        uVar13 = local_1a0;
        if ((long)piVar5 <= lVar11) goto LAB_0011adc5;
        local_e8 = phi_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        uVar10 = 0;
        for (; lVar3 < (long)piVar5; piVar5 = (int128_t *)((long)piVar5 + -1)) {
          iVar1 = mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[(long)piVar5];
          if (((long)iVar1 != 0) &&
             (iVar2 < lpf.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)piVar5])) {
            for (; (long)uVar10 <= (long)(x / ((long)piVar5 * lVar11) - low); uVar10 = uVar10 + 2) {
              uVar12 = *(ulong *)(BitSieve::set_bit_ + (ulong)((uint)uVar10 & 0x7f) * 8) &
                       *(ulong *)((long)phi.low + (uVar10 >> 7) * 8);
              if (uVar12 != 0) {
                uVar12 = low + uVar10;
              }
              phi_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar6] =
                   phi_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar6] + uVar12;
            }
            local_190 = local_190 -
                        (long)piVar5 * lVar11 * (long)iVar1 *
                        phi_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar6];
          }
        }
        for (; (long)uVar10 < local_198; uVar10 = uVar10 + 2) {
          uVar12 = *(ulong *)(BitSieve::set_bit_ + (ulong)((uint)uVar10 & 0x7f) * 8) &
                   *(ulong *)((long)phi.low + (uVar10 >> 7) * 8);
          if (uVar12 != 0) {
            uVar12 = low + uVar10;
          }
          phi_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar6] =
               phi_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
               ._M_start[uVar6] + uVar12;
        }
        local_e0 = lVar11;
        anon_unknown.dwarf_ce70d::cross_off
                  ((BitSieve *)&phi,low,local_1b0,lVar11,
                   wheel.wheel_.
                   super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar6);
      }
      for (; uVar13 = local_1a0, (long)uVar6 < local_f8; uVar6 = uVar6 + 1) {
        lVar3 = (long)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar6];
        piVar5 = (int128_t *)(x / (long)(low * lVar3));
        if ((long)local_1b8 <= (long)piVar5) {
          piVar5 = local_1b8;
        }
        lVar9 = (long)pi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)piVar5];
        lVar11 = x / (long)(local_1b0 * lVar3);
        lVar4 = (long)local_1b8 / lVar3;
        if ((long)local_1b8 / lVar3 <= lVar3) {
          lVar4 = lVar3;
        }
        if (lVar4 <= lVar11) {
          lVar4 = lVar11;
        }
        iVar2 = primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[lVar9];
        if (iVar2 <= primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar6]) break;
        uVar10 = 0;
        while (lVar4 < iVar2) {
          lVar11 = iVar2 * lVar3;
          for (; (long)uVar10 <= (long)(x / lVar11 - low); uVar10 = uVar10 + 2) {
            uVar12 = *(ulong *)(BitSieve::set_bit_ + (ulong)((uint)uVar10 & 0x7f) * 8) &
                     *(ulong *)((long)phi.low + (uVar10 >> 7) * 8);
            if (uVar12 != 0) {
              uVar12 = low + uVar10;
            }
            phi_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar6] =
                 phi_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6] + uVar12;
          }
          local_190 = local_190 +
                      lVar11 * phi_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar6];
          lVar11 = lVar9 + -1;
          lVar9 = lVar9 + -1;
          iVar2 = primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11];
        }
        for (; (long)uVar10 < local_198; uVar10 = uVar10 + 2) {
          uVar12 = *(ulong *)(BitSieve::set_bit_ + (ulong)((uint)uVar10 & 0x7f) * 8) &
                   *(ulong *)((long)phi.low + (uVar10 >> 7) * 8);
          if (uVar12 != 0) {
            uVar12 = low + uVar10;
          }
          phi_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar6] =
               phi_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
               ._M_start[uVar6] + uVar12;
        }
        anon_unknown.dwarf_ce70d::cross_off
                  ((BitSieve *)&phi,low,local_1b0,lVar3,
                   wheel.wheel_.
                   super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar6);
      }
      goto LAB_0011adc5;
    }
    x_05 = "S2";
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"S2",&local_1c1);
    uVar10 = local_190;
    local_138.low._0_8_ = local_190;
    uVar7 = (long)local_190 >> 0x3f;
    res.high._0_8_ = uVar7;
    res.low = (uint128_t)SEXT816((long)local_190);
    res.high._8_8_ = uVar7;
    uVar12 = local_190;
    uVar15 = uVar7;
    local_138.low._8_8_ = uVar7;
    local_138.high._0_8_ = uVar7;
    local_138.high._8_8_ = uVar7;
    print(&local_188,res,local_110);
    piVar5 = local_1b8;
    std::__cxx11::string::~string((string *)&local_188);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&phi_1.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&pi.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>::~_Vector_base
              ((_Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_> *)&wheel);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&phi);
    phi.high._0_8_ = (ulong)s1.high + uVar7;
    phi.high._8_8_ = s1.high._8_8_ + uVar7 + (ulong)CARRY8((ulong)s1.high,uVar7);
    phi.low._0_8_ = uVar10 + (ulong)s1.low;
    uVar10 = (ulong)CARRY8(uVar10,(ulong)s1.low);
    phi.low._8_8_ = uVar7 + s1.low._8_8_ + uVar10;
    if (CARRY8(uVar7,s1.low._8_8_) || CARRY8(uVar7 + s1.low._8_8_,uVar10)) {
      bVar14 = 0xfffffffffffffffe < (ulong)phi.high;
      phi.high._0_8_ = (ulong)phi.high + 1;
      phi.high._8_8_ = phi.high._8_8_ + (ulong)bVar14;
    }
    prime_sum_tiny(piVar5,(int64_t)x_05);
    x_04._8_8_ = uVar15;
    x_04._0_8_ = uVar12;
    int256_t::operator+(&local_138,&phi,(__int128)x_04);
    int256_t::operator-((int256_t *)&local_188,&local_138,1);
    iVar8 = (long)local_188._M_dataplus._M_p - (long)p2.low;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&primes.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&lpf.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&mu.super__Vector_base<int,_std::allocator<int>_>);
  }
  return iVar8;
}

Assistant:

int64_t pi_lmo5(int64_t x)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t z = x / y;
  int64_t c = PhiTiny::get_c(y);

  print("");
  print("=== pi_lmo5(x) ===");
  print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
  print(x, y, z, c, alpha, 1);

  int256_t p2 = P2(x, y, 1);
  vector<int32_t> mu = generate_moebius(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> primes = generate_primes(y);

  int256_t s1 = S1(x, y, c, 1);
  int256_t s2 = S2(x, y, c, primes, lpf, mu);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return int64_t(sum);
}